

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O2

pair<unsigned_int,_unsigned_int> __thiscall
FMB::FiniteModelMultiSorted::getDomainConstant(FiniteModelMultiSorted *this,Term *t)

{
  bool bVar1;
  UserErrorException *this_00;
  Term *t_local;
  pair<unsigned_int,_unsigned_int> pair;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pair.first = 0;
  pair.second = 0;
  t_local = t;
  bVar1 = Lib::
          DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::find(&this->_domainConstantsRev,&t_local,&pair);
  if (bVar1) {
    return pair;
  }
  this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
  Kernel::Term::toString_abi_cxx11_(&local_78,t_local,true);
  std::operator+(&local_58,"Evaluated to ",&local_78);
  std::operator+(&local_38,&local_58," when expected a domain constant, probably a partial model");
  Lib::UserErrorException::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

std::pair<unsigned,unsigned> getDomainConstant(Term* t)
  {
    std::pair<unsigned,unsigned> pair;
    if(_domainConstantsRev.find(t,pair)) return pair;
    USER_ERROR("Evaluated to "+t->toString()+" when expected a domain constant, probably a partial model");
  }